

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple-test.c++
# Opt level: O3

void __thiscall kj::TestCase93::run(TestCase93 *this)

{
  TupleElement<3U,_kj::StringPtr> *params_2;
  TupleElement<2U,_unsigned_int> *params_2_00;
  TupleElement<3U,_kj::StringPtr> *local_a0;
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition;
  uint i;
  StringPtr local_68;
  Tuple<uint_&,_StringPtr_&,_uint,_StringPtr> t;
  
  t.impl.super_TupleElement<0U,_unsigned_int_&>.value = &i;
  i = 0x7b;
  local_68.content.ptr = "foo";
  local_68.content.size_ = 4;
  params_2 = &t.impl.super_TupleElement<3U,_kj::StringPtr>;
  t.impl.super_TupleElement<2U,_unsigned_int>.value = 0x141;
  t.impl.super_TupleElement<3U,_kj::StringPtr>.value.content.ptr = "bar";
  t.impl.super_TupleElement<3U,_kj::StringPtr>.value.content.size_ = 4;
  local_a0 = (TupleElement<3U,_kj::StringPtr> *)&local_68;
  t.impl.super_TupleElement<1U,_kj::StringPtr_&>.value = &local_68;
  kj::_::DebugExpression<kj::StringPtr&>::operator==
            (&_kjCondition,(DebugExpression<kj::StringPtr&> *)&local_a0,(char (*) [4])0x4d8ac4);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[40],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&,kj::StringPtr&,char_const(&)[4]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,99,ERROR,
               "\"failed: expected \" \"(get<1>(t)) == (\\\"foo\\\")\", _kjCondition, get<1>(t), \"foo\""
               ,(char (*) [40])"failed: expected (get<1>(t)) == (\"foo\")",&_kjCondition,&local_68,
               (char (*) [4])0x4d8ac4);
  }
  local_a0 = params_2;
  kj::_::DebugExpression<kj::StringPtr&>::operator==
            (&_kjCondition,(DebugExpression<kj::StringPtr&> *)&local_a0,(char (*) [4])0x4b858f);
  if (kj::_::Debug::minSeverity < 3 && _kjCondition.result == false) {
    kj::_::Debug::
    log<char_const(&)[40],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&,kj::StringPtr&,char_const(&)[4]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x65,ERROR,
               "\"failed: expected \" \"(get<3>(t)) == (\\\"bar\\\")\", _kjCondition, get<3>(t), \"bar\""
               ,(char (*) [40])"failed: expected (get<3>(t)) == (\"bar\")",&_kjCondition,
               &params_2->value,(char (*) [4])0x4b858f);
  }
  i = 0x1c8;
  local_68.content.ptr = "baz";
  local_68.content.size_ = 4;
  _kjCondition.result = *t.impl.super_TupleElement<0U,_unsigned_int_&>.value == 0x1c8;
  _kjCondition.left = (StringPtr *)t.impl.super_TupleElement<0U,_unsigned_int_&>.value;
  _kjCondition.right._0_4_ = 0x1c8;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_a0 = (TupleElement<3U,_kj::StringPtr> *)CONCAT44(local_a0._4_4_,0x1c8);
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x6a,ERROR,
               "\"failed: expected \" \"(get<0>(t)) == (456)\", _kjCondition, get<0>(t), 456",
               (char (*) [38])"failed: expected (get<0>(t)) == (456)",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition,
               t.impl.super_TupleElement<0U,_unsigned_int_&>.value,(int *)&local_a0);
  }
  params_2_00 = &t.impl.super_TupleElement<2U,_unsigned_int>;
  local_a0 = (TupleElement<3U,_kj::StringPtr> *)t.impl.super_TupleElement<1U,_kj::StringPtr_&>.value
  ;
  kj::_::DebugExpression<kj::StringPtr&>::operator==
            (&_kjCondition,(DebugExpression<kj::StringPtr&> *)&local_a0,(char (*) [4])0x4aa378);
  if (kj::_::Debug::minSeverity < 3 && _kjCondition.result == false) {
    kj::_::Debug::
    log<char_const(&)[40],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&,kj::StringPtr&,char_const(&)[4]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x6b,ERROR,
               "\"failed: expected \" \"(get<1>(t)) == (\\\"baz\\\")\", _kjCondition, get<1>(t), \"baz\""
               ,(char (*) [40])"failed: expected (get<1>(t)) == (\"baz\")",&_kjCondition,
               t.impl.super_TupleElement<1U,_kj::StringPtr_&>.value,(char (*) [4])0x4aa378);
  }
  _kjCondition.right._0_4_ = 0x141;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.result = t.impl.super_TupleElement<2U,_unsigned_int>.value == 0x141;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = (StringPtr *)params_2_00;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_a0 = (TupleElement<3U,_kj::StringPtr> *)CONCAT44(local_a0._4_4_,0x141);
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x6c,ERROR,
               "\"failed: expected \" \"(get<2>(t)) == (321)\", _kjCondition, get<2>(t), 321",
               (char (*) [38])"failed: expected (get<2>(t)) == (321)",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition,&params_2_00->value,
               (int *)&local_a0);
  }
  local_a0 = params_2;
  kj::_::DebugExpression<kj::StringPtr&>::operator==
            (&_kjCondition,(DebugExpression<kj::StringPtr&> *)&local_a0,(char (*) [4])0x4b858f);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[40],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&,kj::StringPtr&,char_const(&)[4]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/tuple-test.c++"
               ,0x6d,ERROR,
               "\"failed: expected \" \"(get<3>(t)) == (\\\"bar\\\")\", _kjCondition, get<3>(t), \"bar\""
               ,(char (*) [40])"failed: expected (get<3>(t)) == (\"bar\")",&_kjCondition,
               &params_2->value,(char (*) [4])0x4b858f);
  }
  return;
}

Assistant:

TEST(Tuple, RefTuple) {
  uint i = 123;
  StringPtr s = "foo";

  Tuple<uint&, StringPtr&, uint, StringPtr> t = refTuple(i, s, 321, "bar");
  EXPECT_EQ(get<0>(t), 123);
  EXPECT_EQ(get<1>(t), "foo");
  EXPECT_EQ(get<2>(t), 321);
  EXPECT_EQ(get<3>(t), "bar");

  i = 456;
  s = "baz";

  EXPECT_EQ(get<0>(t), 456);
  EXPECT_EQ(get<1>(t), "baz");
  EXPECT_EQ(get<2>(t), 321);
  EXPECT_EQ(get<3>(t), "bar");
}